

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::DynamicMapField
          (DynamicMapField *this,Message *default_entry,Arena *arena)

{
  Arena *in_RSI;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_RDI;
  Arena *in_stack_ffffffffffffffc8;
  
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
  TypeDefinedMapFieldBase
            ((TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->arena_ = (Arena *)&PTR__DynamicMapField_008d6428;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Map
            (in_RDI,in_stack_ffffffffffffffc8);
  in_RDI[4].arena_ = in_RSI;
  return;
}

Assistant:

DynamicMapField::DynamicMapField(const Message* default_entry, Arena* arena)
    : TypeDefinedMapFieldBase<MapKey, MapValueRef>(arena),
      map_(arena),
      default_entry_(default_entry) {}